

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
Array_MultiLineWithMultipleItems_Test::TestBody(Array_MultiLineWithMultipleItems_Test *this)

{
  pointer *this_00;
  allocator<sax_event_t> *this_01;
  initializer_list<sax_event_t> __l;
  bool bVar1;
  char *message;
  sax_event_t *local_668;
  AssertHelper local_618;
  Message local_610;
  undefined1 local_608 [8];
  AssertionResult gtest_ar;
  string local_5f0;
  allocator local_5c9;
  string local_5c8;
  allocator local_5a1;
  string local_5a0;
  sax_event_t *local_580;
  sax_event_t local_578;
  sax_event_t local_520;
  sax_event_t local_4c8;
  sax_event_t local_470;
  sax_event_t local_418;
  sax_event_t local_3c0;
  sax_event_t local_368;
  sax_event_t local_310;
  sax_event_t local_2b8;
  sax_event_t local_260;
  iterator local_208;
  pointer local_200;
  undefined1 local_1f8 [8];
  vector<sax_event_t,_std::allocator<sax_event_t>_> expected_events;
  events_aggregator_t handler;
  allocator local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream input;
  Array_MultiLineWithMultipleItems_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"key = [ \r\n 1\t \n,#comment\n \t  2 ,\r\n 3  \t # one more comment\n]",
             &local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  this_00 = &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)this_00);
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)local_190,(events_aggregator_t *)this_00);
  gtest_ar.message_.ptr_._6_1_ = 1;
  local_580 = &local_578;
  sax_event_t::sax_event_t(local_580,start_document);
  local_580 = &local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"key",&local_5a1);
  sax_event_t::sax_event_t(&local_520,key,&local_5a0);
  local_580 = &local_4c8;
  sax_event_t::sax_event_t(local_580,start_array);
  local_580 = &local_470;
  sax_event_t::sax_event_t<int>(local_580,integer,1,(type *)0x0);
  local_580 = &local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c8,"comment",&local_5c9);
  sax_event_t::sax_event_t(&local_418,comment,&local_5c8);
  local_580 = &local_3c0;
  sax_event_t::sax_event_t<int>(local_580,integer,2,(type *)0x0);
  local_580 = &local_368;
  sax_event_t::sax_event_t<int>(local_580,integer,3,(type *)0x0);
  local_580 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5f0," one more comment",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  sax_event_t::sax_event_t(&local_310,comment,&local_5f0);
  local_580 = &local_2b8;
  sax_event_t::sax_event_t<int>(local_580,finish_array,3,(type *)0x0);
  local_580 = &local_260;
  sax_event_t::sax_event_t(local_580,finish_document);
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_208 = &local_578;
  local_200 = (pointer)0xa;
  this_01 = (allocator<sax_event_t> *)((long)&gtest_ar.message_.ptr_ + 5);
  std::allocator<sax_event_t>::allocator(this_01);
  __l._M_len = (size_type)local_200;
  __l._M_array = local_208;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::vector
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8,__l,this_01);
  std::allocator<sax_event_t>::~allocator
            ((allocator<sax_event_t> *)((long)&gtest_ar.message_.ptr_ + 5));
  local_668 = (sax_event_t *)&local_208;
  do {
    local_668 = local_668 + -1;
    sax_event_t::~sax_event_t(local_668);
  } while (local_668 != &local_578);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  testing::internal::EqHelper<false>::
  Compare<std::vector<sax_event_t,std::allocator<sax_event_t>>,std::vector<sax_event_t,std::allocator<sax_event_t>>>
            ((EqHelper<false> *)local_608,"expected_events","handler.events",
             (vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8,
             (vector<sax_event_t,_std::allocator<sax_event_t>_> *)
             &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_608);
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/array.cpp"
               ,0x99,message);
    testing::internal::AssertHelper::operator=(&local_618,&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8);
  events_aggregator_t::~events_aggregator_t
            ((events_aggregator_t *)
             &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

TEST(Array, MultiLineWithMultipleItems) {
    std::istringstream input("key = [ \r\n 1\t \n,#comment\n \t  2 ,\r\n 3  \t # one more comment\n]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_array},
        {sax_event_t::integer, 1},
        {sax_event_t::comment, "comment"},
        {sax_event_t::integer, 2},
        {sax_event_t::integer, 3},
        {sax_event_t::comment, " one more comment"},
        {sax_event_t::finish_array, 3},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}